

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.hpp
# Opt level: O2

uint32_t __thiscall diligent_spirv_cross::CFG::get_visit_order(CFG *this,uint32_t block)

{
  uint __line;
  const_iterator cVar1;
  char *__assertion;
  uint32_t block_local;
  
  cVar1 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->visit_order)._M_h,&block_local);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_false>
      ._M_cur == (__node_type *)0x0) {
    __assertion = "itr != std::end(visit_order)";
    __line = 0x46;
  }
  else {
    if (0 < (int)*(uint32_t *)
                  ((long)cVar1.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_false>
                         ._M_cur + 0xc)) {
      return *(uint32_t *)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_false>
                     ._M_cur + 0xc);
    }
    __assertion = "v > 0";
    __line = 0x48;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cfg.hpp"
                ,__line,"uint32_t diligent_spirv_cross::CFG::get_visit_order(uint32_t) const");
}

Assistant:

uint32_t get_visit_order(uint32_t block) const
	{
		auto itr = visit_order.find(block);
		assert(itr != std::end(visit_order));
		int v = itr->second.get();
		assert(v > 0);
		return uint32_t(v);
	}